

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O1

int Abc_NtkCrossCut(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  int nCutSize;
  int nCutSizeMax;
  int local_30;
  uint local_2c;
  
  local_30 = 0;
  local_2c = 0;
  pVVar6 = pNtk->vObjs;
  if (0 < pVVar6->nSize) {
    lVar4 = 0;
    do {
      if (pVVar6->pArray[lVar4] != (void *)0x0) {
        *(undefined8 *)((long)pVVar6->pArray[lVar4] + 0x40) = 0;
      }
      lVar4 = lVar4 + 1;
      pVVar6 = pNtk->vObjs;
    } while (lVar4 < pVVar6->nSize);
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar2 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar7 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar7) {
      piVar5 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar7;
    }
    if (-500 < iVar2) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar7;
  }
  iVar2 = pNtk->nTravIds;
  pNtk->nTravIds = iVar2 + 1;
  if (iVar2 < 0x3fffffff) {
    pVVar6 = pNtk->vCos;
    if (0 < pVVar6->nSize) {
      lVar4 = 0;
      do {
        Abc_NtkCrossCut_rec((Abc_Obj_t *)pVVar6->pArray[lVar4],&local_30,(int *)&local_2c);
        local_30 = local_30 + -1;
        lVar4 = lVar4 + 1;
        pVVar6 = pNtk->vCos;
      } while (lVar4 < pVVar6->nSize);
    }
    uVar3 = local_2c;
    if (local_30 == 0) {
      printf("Max cross cut size = %6d.  Ratio = %6.2f %%\n",
             ((double)(int)local_2c * 100.0) / (double)pNtk->nObjs,(ulong)local_2c);
      return uVar3;
    }
    __assert_fail("nCutSize == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                  ,0x7f0,"int Abc_NtkCrossCut(Abc_Ntk_t *)");
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkCrossCut( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int nCutSize = 0, nCutSizeMax = 0;
    int i;
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Abc_NtkCrossCut_rec( pObj, &nCutSize, &nCutSizeMax );
        nCutSize--;
    }
    assert( nCutSize == 0 );
    printf( "Max cross cut size = %6d.  Ratio = %6.2f %%\n", nCutSizeMax, 100.0 * nCutSizeMax/Abc_NtkObjNum(pNtk) );
    return nCutSizeMax;
}